

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

value_type_conflict2 __thiscall
Darts::DoubleArrayImpl<void,_void,_int,_void>::traverse
          (DoubleArrayImpl<void,_void,_int,_void> *this,key_type *key,size_t *node_pos,
          size_t *key_pos,size_t length)

{
  unit_type *puVar1;
  uint uVar2;
  bool bVar3;
  id_type iVar4;
  DoubleArrayUnit local_40;
  uint local_3c;
  unit_type unit;
  id_type id;
  size_t length_local;
  size_t *key_pos_local;
  size_t *node_pos_local;
  key_type *key_local;
  DoubleArrayImpl<void,_void,_int,_void> *this_local;
  
  local_3c = (uint)*node_pos;
  local_40.unit_ = this->array_[*node_pos & 0xffffffff].unit_;
  _unit = length;
  if (length == 0) {
    while (key[*key_pos] != '\0') {
      iVar4 = Details::DoubleArrayUnit::offset(&local_40);
      local_3c = iVar4 ^ (byte)key[*key_pos] ^ local_3c;
      local_40.unit_ = this->array_[local_3c].unit_;
      iVar4 = Details::DoubleArrayUnit::label(&local_40);
      if (iVar4 != (byte)key[*key_pos]) {
        return -2;
      }
      *node_pos = (ulong)local_3c;
      *key_pos = *key_pos + 1;
    }
  }
  else {
    while (*key_pos < _unit) {
      iVar4 = Details::DoubleArrayUnit::offset(&local_40);
      local_3c = iVar4 ^ (byte)key[*key_pos] ^ local_3c;
      local_40.unit_ = this->array_[local_3c].unit_;
      iVar4 = Details::DoubleArrayUnit::label(&local_40);
      if (iVar4 != (byte)key[*key_pos]) {
        return -2;
      }
      *node_pos = (ulong)local_3c;
      *key_pos = *key_pos + 1;
    }
  }
  bVar3 = Details::DoubleArrayUnit::has_leaf(&local_40);
  uVar2 = local_3c;
  if (bVar3) {
    puVar1 = this->array_;
    iVar4 = Details::DoubleArrayUnit::offset(&local_40);
    local_40.unit_ = puVar1[uVar2 ^ iVar4].unit_;
    this_local._4_4_ = Details::DoubleArrayUnit::value(&local_40);
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

inline typename DoubleArrayImpl<A, B, T, C>::value_type
DoubleArrayImpl<A, B, T, C>::traverse(const key_type *key,
    std::size_t &node_pos, std::size_t &key_pos, std::size_t length) const {
  id_type id = static_cast<id_type>(node_pos);
  unit_type unit = array_[id];

  if (length != 0) {
    for ( ; key_pos < length; ++key_pos) {
      id ^= unit.offset() ^ static_cast<uchar_type>(key[key_pos]);
      unit = array_[id];
      if (unit.label() != static_cast<uchar_type>(key[key_pos])) {
        return static_cast<value_type>(-2);
      }
      node_pos = id;
    }
  } else {
    for ( ; key[key_pos] != '\0'; ++key_pos) {
      id ^= unit.offset() ^ static_cast<uchar_type>(key[key_pos]);
      unit = array_[id];
      if (unit.label() != static_cast<uchar_type>(key[key_pos])) {
        return static_cast<value_type>(-2);
      }
      node_pos = id;
    }
  }

  if (!unit.has_leaf()) {
    return static_cast<value_type>(-1);
  }
  unit = array_[id ^ unit.offset()];
  return static_cast<value_type>(unit.value());
}